

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_png_to_func
              (stbi_write_func *func,void *context,int x,int y,int comp,void *data,int stride_bytes)

{
  uchar *__ptr;
  uchar *png;
  void *pvStack_38;
  int len;
  void *data_local;
  int local_28;
  int comp_local;
  int y_local;
  int x_local;
  void *context_local;
  stbi_write_func *func_local;
  
  pvStack_38 = data;
  data_local._4_4_ = comp;
  local_28 = y;
  comp_local = x;
  _y_local = context;
  context_local = func;
  __ptr = stbi_write_png_to_mem((uchar *)data,stride_bytes,x,y,comp,(int *)((long)&png + 4));
  if (__ptr != (uchar *)0x0) {
    (*(code *)context_local)(_y_local,__ptr,png._4_4_);
    free(__ptr);
  }
  func_local._4_4_ = (uint)(__ptr != (uchar *)0x0);
  return func_local._4_4_;
}

Assistant:

STBIWDEF int stbi_write_png_to_func(stbi_write_func *func, void *context, int x,
                                    int y, int comp, const void *data,
                                    int stride_bytes) {
  int len;
  unsigned char *png = stbi_write_png_to_mem((unsigned char *)data,
                                             stride_bytes, x, y, comp, &len);
  if (png == NULL) return 0;
  func(context, png, len);
  STBIW_FREE(png);
  return 1;
}